

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall
QListViewPrivate::removeCurrentAndDisabled
          (QListViewPrivate *this,QList<QModelIndex> *indexes,QModelIndex *current)

{
  long lVar1;
  quintptr qVar2;
  int iVar3;
  bool bVar4;
  iterator aend;
  iterator iVar5;
  long lVar6;
  QModelIndex *pQVar7;
  QModelIndex *pQVar8;
  QModelIndex *pQVar9;
  long lVar10;
  const_iterator abegin;
  long in_FS_OFFSET;
  anon_class_32_2_1156e026_for__M_pred local_78;
  anon_class_32_2_1156e026_for__M_pred local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.current.i = current->i;
  local_78.current.m.ptr = (current->m).ptr;
  local_78.current.r = current->r;
  local_78.current.c = current->c;
  pQVar8 = (indexes->d).ptr;
  lVar1 = (indexes->d).size;
  lVar10 = lVar1 * 0x18;
  pQVar9 = pQVar8;
  local_78.this = this;
  local_58.this = this;
  local_58.current._0_8_ = local_78.current._0_8_;
  local_58.current.i = local_78.current.i;
  local_58.current.m.ptr = local_78.current.m.ptr;
  for (lVar6 = lVar1 >> 2; pQVar7 = pQVar9, 0 < lVar6; lVar6 = lVar6 + -1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qlistview.cpp:1972:32)>
            ::anon_class_32_2_1156e026_for__M_pred::operator()(&local_58,pQVar9);
    if (bVar4) goto LAB_00514343;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qlistview.cpp:1972:32)>
            ::anon_class_32_2_1156e026_for__M_pred::operator()(&local_58,pQVar9 + 1);
    pQVar7 = pQVar9 + 1;
    if (bVar4) goto LAB_00514343;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qlistview.cpp:1972:32)>
            ::anon_class_32_2_1156e026_for__M_pred::operator()(&local_58,pQVar9 + 2);
    pQVar7 = pQVar9 + 2;
    if (bVar4) goto LAB_00514343;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qlistview.cpp:1972:32)>
            ::anon_class_32_2_1156e026_for__M_pred::operator()(&local_58,pQVar9 + 3);
    pQVar7 = pQVar9 + 3;
    if (bVar4) goto LAB_00514343;
    pQVar9 = pQVar9 + 4;
    lVar10 = lVar10 + -0x60;
  }
  lVar10 = lVar10 / 0x18;
  if (lVar10 != 1) {
    if (lVar10 != 2) {
      pQVar7 = pQVar8 + lVar1;
      if ((lVar10 != 3) ||
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qlistview.cpp:1972:32)>
                  ::anon_class_32_2_1156e026_for__M_pred::operator()(&local_58,pQVar9),
         pQVar7 = pQVar9, bVar4)) goto LAB_00514343;
      pQVar7 = pQVar9 + 1;
    }
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qlistview.cpp:1972:32)>
            ::anon_class_32_2_1156e026_for__M_pred::operator()(&local_58,pQVar7);
    if (bVar4) goto LAB_00514343;
    pQVar9 = pQVar7 + 1;
  }
  bVar4 = __gnu_cxx::__ops::
          _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qlistview.cpp:1972:32)>
          ::anon_class_32_2_1156e026_for__M_pred::operator()(&local_58,pQVar9);
  pQVar7 = pQVar8 + lVar1;
  if (bVar4) {
    pQVar7 = pQVar9;
  }
LAB_00514343:
  if (((long)pQVar7 - (long)pQVar8) / 0x18 != (indexes->d).size) {
    aend = QList<QModelIndex>::end(indexes);
    iVar5 = QList<QModelIndex>::begin(indexes);
    abegin.i = iVar5.i + ((long)pQVar7 - (long)pQVar8);
    pQVar8 = abegin.i;
    while (pQVar9 = pQVar8, pQVar8 = pQVar9 + 1, pQVar8 != aend.i) {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qlistview.cpp:1972:32)>
              ::anon_class_32_2_1156e026_for__M_pred::operator()(&local_78,pQVar8);
      if (!bVar4) {
        ((abegin.i)->m).ptr = pQVar9[1].m.ptr;
        iVar3 = pQVar8->c;
        qVar2 = pQVar9[1].i;
        (abegin.i)->r = pQVar8->r;
        (abegin.i)->c = iVar3;
        (abegin.i)->i = qVar2;
        abegin.i = abegin.i + 1;
      }
    }
    QList<QModelIndex>::erase(indexes,abegin,(const_iterator)aend.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListViewPrivate::removeCurrentAndDisabled(QList<QModelIndex> *indexes,
                                                const QModelIndex &current) const
{
    auto isCurrentOrDisabled = [this, current](const QModelIndex &index) {
        return !isIndexEnabled(index) || index == current;
    };
    indexes->removeIf(isCurrentOrDisabled);
}